

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O1

void InitSegmentJob(VP8Encoder *enc,SegmentJob *job,int start_row,int end_row)

{
  VP8EncIterator *it;
  WebPWorkerInterface *pWVar1;
  int iVar2;
  
  pWVar1 = WebPGetWorkerInterface();
  (*pWVar1->Init)(&job->worker);
  (job->worker).data1 = job;
  it = &job->it;
  (job->worker).data2 = it;
  (job->worker).hook = DoSegmentsJob;
  VP8IteratorInit(enc,it);
  VP8IteratorSetRow(it,start_row);
  VP8IteratorSetCountDown(it,(end_row - start_row) * enc->mb_w_);
  iVar2 = 0x14;
  if (start_row != 0) {
    iVar2 = 0;
  }
  memset(job->alphas,0,0x408);
  job->delta_progress = iVar2;
  return;
}

Assistant:

static void InitSegmentJob(VP8Encoder* const enc, SegmentJob* const job,
                           int start_row, int end_row) {
  WebPGetWorkerInterface()->Init(&job->worker);
  job->worker.data1 = job;
  job->worker.data2 = &job->it;
  job->worker.hook = DoSegmentsJob;
  VP8IteratorInit(enc, &job->it);
  VP8IteratorSetRow(&job->it, start_row);
  VP8IteratorSetCountDown(&job->it, (end_row - start_row) * enc->mb_w_);
  memset(job->alphas, 0, sizeof(job->alphas));
  job->alpha = 0;
  job->uv_alpha = 0;
  // only one of both jobs can record the progress, since we don't
  // expect the user's hook to be multi-thread safe
  job->delta_progress = (start_row == 0) ? 20 : 0;
}